

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintUInt64_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,uint64_t val)

{
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  uint64_t val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._8_8_ = val;
  anon_unknown_1::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintUInt64
            (&this->delegate_,generator.output_.field_2._8_8_,(BaseTextGenerator *)local_48);
  (anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_48);
  anon_unknown_1::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintUInt64(uint64_t val) const {
  FORWARD_IMPL(PrintUInt64, val);
}